

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xrespondent.c
# Opt level: O0

int nn_xrespondent_add(nn_sockbase *self,nn_pipe *pipe)

{
  undefined8 *data_00;
  nn_hash_item *in_RSI;
  nn_fq_data *in_RDI;
  nn_hash *unaff_retaddr;
  size_t sz;
  int rcvprio;
  nn_xrespondent_data *data;
  nn_xrespondent *xrespondent;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  undefined1 uVar1;
  nn_fq_data *pnVar2;
  nn_fq_data *data_01;
  nn_fq *self_00;
  int local_24;
  uint32_t key;
  
  pnVar2 = in_RDI;
  if (in_RDI == (nn_fq_data *)0x0) {
    pnVar2 = (nn_fq_data *)0x0;
  }
  self_00 = (nn_fq *)0x4;
  data_01 = pnVar2;
  nn_pipe_getopt((nn_pipe *)0x4,(int)((ulong)pnVar2 >> 0x20),(int)pnVar2,
                 (void *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
                 (size_t *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  key = (uint32_t)((ulong)in_RDI >> 0x20);
  if (self_00 != (nn_fq *)0x4) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","sz == sizeof (rcvprio)",
            "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/protocols/survey/xrespondent.c"
            ,0x5e);
    fflush(_stderr);
    nn_err_abort();
  }
  uVar1 = 0 < local_24 && local_24 < 0x11;
  if (0 >= local_24 || local_24 >= 0x11) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rcvprio >= 1 && rcvprio <= 16",
            "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/protocols/survey/xrespondent.c"
            ,0x5f);
    fflush(_stderr);
    nn_err_abort();
  }
  data_00 = (undefined8 *)nn_alloc_(0x132277);
  if (data_00 == (undefined8 *)0x0) {
    nn_backtrace_print();
    fprintf(_stderr,"Out of memory (%s:%d)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/protocols/survey/xrespondent.c"
            ,0x62);
    fflush(_stderr);
    nn_err_abort();
  }
  *data_00 = in_RSI;
  nn_hash_item_init((nn_hash_item *)0x1322ee);
  *(undefined4 *)(data_00 + 8) = 0;
  nn_hash_insert(unaff_retaddr,key,in_RSI);
  *(int *)&(pnVar2->priodata).item.next = *(int *)&(pnVar2->priodata).item.next + 1;
  nn_fq_add(self_00,data_01,(nn_pipe *)CONCAT17(uVar1,in_stack_ffffffffffffffc0),
            in_stack_ffffffffffffffbc);
  nn_pipe_setdata((nn_pipe *)in_RSI,data_00);
  return 0;
}

Assistant:

int nn_xrespondent_add (struct nn_sockbase *self, struct nn_pipe *pipe)
{
    struct nn_xrespondent *xrespondent;
    struct nn_xrespondent_data *data;
    int rcvprio;
    size_t sz;

    xrespondent = nn_cont (self, struct nn_xrespondent, sockbase);

    sz = sizeof (rcvprio);
    nn_pipe_getopt (pipe, NN_SOL_SOCKET, NN_RCVPRIO, &rcvprio, &sz);
    nn_assert (sz == sizeof (rcvprio));
    nn_assert (rcvprio >= 1 && rcvprio <= 16);

    data = nn_alloc (sizeof (*data), "pipe data (xrespondent)");
    alloc_assert (data);

    data->pipe = pipe;
    nn_hash_item_init (&data->outitem);
    data->flags = 0;
    nn_hash_insert (&xrespondent->outpipes, xrespondent->next_key & 0x7fffffff,
        &data->outitem);
    xrespondent->next_key++;
    nn_fq_add (&xrespondent->inpipes, &data->initem, pipe, rcvprio);
    nn_pipe_setdata (pipe, data);

    return 0;
}